

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameFinder.cpp
# Opt level: O2

vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_> *
__thiscall
OpenMD::NameFinder::getMatchedChildren
          (vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
           *__return_storage_ptr__,NameFinder *this,TreeNodePtr *node,string *name)

{
  bool bVar1;
  element_type *peVar2;
  NameFinder *pNVar3;
  NameFinder *this_00;
  NameFinder *pNVar4;
  
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  peVar2 = (node->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (NameFinder *)__return_storage_ptr__;
  pNVar4 = *(NameFinder **)
            ((long)&(peVar2->children)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
  while (pNVar4 != (NameFinder *)&(peVar2->children)._M_t._M_impl.super__Rb_tree_header) {
    bVar1 = isMatched(this_00,(string *)&pNVar4->root_,name);
    if (bVar1) {
      std::
      vector<std::shared_ptr<OpenMD::TreeNode>,_std::allocator<std::shared_ptr<OpenMD::TreeNode>_>_>
      ::push_back(__return_storage_ptr__,
                  (value_type *)
                  &pNVar4[1].nObjects_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
    }
    pNVar3 = (NameFinder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pNVar4);
    peVar2 = (node->super___shared_ptr<OpenMD::TreeNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    this_00 = pNVar4;
    pNVar4 = pNVar3;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TreeNodePtr> NameFinder::getMatchedChildren(
      TreeNodePtr node, const std::string& name) {
    std::vector<TreeNodePtr> matchedNodes;
    std::map<std::string, TreeNodePtr>::iterator i;
    for (i = node->children.begin(); i != node->children.end(); ++i) {
      if (isMatched(i->first, name)) { matchedNodes.push_back(i->second); }
    }

    return matchedNodes;
  }